

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

disk_config * __thiscall foxxll::config::disk(config *this,size_t disk)

{
  pointer pdVar1;
  ulong uVar2;
  
  if (this->is_initialized == false) {
    (*this->_vptr_config[3])(this);
  }
  pdVar1 = (this->disks_list).
           super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->disks_list).
                 super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) * 0x4ec4ec4ec4ec4ec5
  ;
  if (disk <= uVar2 && uVar2 - disk != 0) {
    return pdVar1 + disk;
  }
  __assert_fail("disk < disks_list.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/foxxll/mng/config.cpp"
                ,0xde,"disk_config &foxxll::config::disk(size_t)");
}

Assistant:

disk_config& config::disk(size_t disk)
{
    check_initialized();
    assert(disk < disks_list.size());
    return disks_list[disk];
}